

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

ImageHeaders core::image::load_jpg_file_headers(string *filename)

{
  int iVar1;
  FILE *__stream;
  FileException *this;
  int *piVar2;
  char *msg;
  Exception *pEVar3;
  undefined8 uVar4;
  ImageHeaders IVar5;
  undefined8 local_380;
  jpeg_decompress_struct cinfo;
  jpeg_error_mgr jerr;
  allocator local_21;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    this = (FileException *)__cxa_allocate_exception(0x48);
    piVar2 = __errno_location();
    msg = strerror(*piVar2);
    util::FileException::FileException(this,filename,msg);
    __cxa_throw(this,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  local_380 = jpeg_std_error(&cinfo.cquantize);
  cinfo.cquantize = (jpeg_color_quantizer *)jpg_error_handler;
  jerr.error_exit = jpg_message_handler;
  jpeg_CreateDecompress(&local_380,0x50,0x290);
  jpeg_stdio_src(&local_380,__stream);
  iVar1 = jpeg_read_header(&local_380,0);
  if (iVar1 == 1) {
    if (0xfffffffd < cinfo.num_components - 3U) {
      jpeg_destroy_decompress();
      fclose(__stream);
      uVar4 = 0x100000003;
      if (cinfo.num_components != 2) {
        uVar4 = 0x100000001;
      }
      IVar5.channels = (int)uVar4;
      IVar5.type = (int)((ulong)uVar4 >> 0x20);
      IVar5._0_8_ = cinfo.src;
      return IVar5;
    }
    pEVar3 = (Exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&jerr.first_addon_message,"Invalid JPEG color space",&local_21);
    util::Exception::Exception(pEVar3,(string *)&jerr.first_addon_message);
    __cxa_throw(pEVar3,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  pEVar3 = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&jerr.first_addon_message,"JPEG header not recognized",&local_21);
  util::Exception::Exception(pEVar3,(string *)&jerr.first_addon_message);
  __cxa_throw(pEVar3,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

ImageHeaders
load_jpg_file_headers (std::string const& filename)
{
    FILE* fp = std::fopen(filename.c_str(), "rb");
    if (fp == nullptr)
        throw util::FileException(filename, std::strerror(errno));

    jpeg_decompress_struct cinfo;
    jpeg_error_mgr jerr;
    ImageHeaders headers;
    try
    {
        /* Setup error handler and JPEG reader. */
        cinfo.err = jpeg_std_error(&jerr);
        jerr.error_exit = &jpg_error_handler;
        jerr.emit_message = &jpg_message_handler;
        jpeg_create_decompress(&cinfo);
        jpeg_stdio_src(&cinfo, fp);

        /* Read JPEG header. */
        int ret = jpeg_read_header(&cinfo, static_cast<boolean>(false));
        if (ret != JPEG_HEADER_OK)
            throw util::Exception("JPEG header not recognized");

        if (cinfo.out_color_space != JCS_GRAYSCALE
            && cinfo.out_color_space != JCS_RGB)
            throw util::Exception("Invalid JPEG color space");

        headers.width = cinfo.image_width;
        headers.height = cinfo.image_height;
        headers.channels = (cinfo.out_color_space == JCS_RGB ? 3 : 1);
        headers.type = IMAGE_TYPE_UINT8;

        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
    }
    catch (...)
    {
        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
        throw;
    }

    return headers;
}